

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCudaLoadStructures.hpp
# Opt level: O2

void __thiscall TasGrid::CudaGlobalData<float>::clearNodes(CudaGlobalData<float> *this)

{
  this->num_basis = 0;
  GpuVector<float>::clear(&this->nodes);
  GpuVector<float>::clear(&this->coeff);
  GpuVector<int>::clear(&this->nodes_per_level);
  GpuVector<int>::clear(&this->offset_per_level);
  GpuVector<int>::clear(&this->map_dimension);
  GpuVector<int>::clear(&this->map_level);
  GpuVector<float>::clear(&this->tensor_weights);
  GpuVector<int>::clear(&this->active_tensors);
  GpuVector<int>::clear(&this->active_num_points);
  GpuVector<int>::clear(&this->dim_offsets);
  GpuVector<int>::clear(&this->map_tensor);
  GpuVector<int>::clear(&this->map_index);
  GpuVector<int>::clear(&this->map_reference);
  return;
}

Assistant:

void clearNodes(){
        num_basis = 0;
        nodes.clear();
        coeff.clear();
        nodes_per_level.clear();
        offset_per_level.clear();
        map_dimension.clear();
        map_level.clear();
        tensor_weights.clear();
        active_tensors.clear();
        active_num_points.clear();
        dim_offsets.clear();
        map_tensor.clear();
        map_index.clear();
        map_reference.clear();
    }